

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

CappedArray<char,_26UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_26UL> *__return_storage_ptr__,Stringifier *this,longlong i)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  uint8_t *puVar5;
  uint8_t reverse [25];
  
  if (i == 0) {
    puVar5 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    uVar2 = -i;
    if (0 < i) {
      uVar2 = i;
    }
    puVar5 = reverse;
    for (; uVar2 != 0; uVar2 = uVar2 / 10) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      *puVar5 = SUB161(auVar1 % ZEXT816(10),0);
      puVar5 = puVar5 + 1;
    }
    if (i < 0) {
      pcVar3 = __return_storage_ptr__->content + 1;
      __return_storage_ptr__->content[0] = '-';
      goto LAB_00191053;
    }
  }
  pcVar3 = __return_storage_ptr__->content;
LAB_00191053:
  sVar4 = (long)pcVar3 - (long)__return_storage_ptr__->content;
  for (; reverse < puVar5; puVar5 = puVar5 + -1) {
    *pcVar3 = puVar5[-1] + '0';
    pcVar3 = pcVar3 + 1;
    sVar4 = sVar4 + 1;
  }
  __return_storage_ptr__->currentSize = sVar4;
  return __return_storage_ptr__;
}

Assistant:

static CappedArray<char, sizeof(T) * 3 + 2> stringifyImpl(T i) {
  // We don't use sprintf() because it's not async-signal-safe (for strPreallocated()).
  CappedArray<char, sizeof(T) * 3 + 2> result;
  bool negative = i < 0;
  Unsigned u = negative ? -i : i;
  uint8_t reverse[sizeof(T) * 3 + 1];
  uint8_t* p = reverse;
  if (u == 0) {
    *p++ = 0;
  } else {
    while (u > 0) {
      *p++ = u % 10;
      u /= 10;
    }
  }

  char* p2 = result.begin();
  if (negative) *p2++ = '-';
  while (p > reverse) {
    *p2++ = '0' + *--p;
  }
  result.setSize(p2 - result.begin());
  return result;
}